

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O0

Section __thiscall
QtPrivate::QCalendarMonthValidator::handleKey(QCalendarMonthValidator *this,int key)

{
  int pressedKey;
  int key_local;
  QCalendarMonthValidator *this_local;
  Section local_4;
  
  if ((key == 0x1000014) || (key == 0x1000012)) {
    this->m_pos = 0;
    local_4 = ThisSection;
  }
  else if (key == 0x1000013) {
    this->m_pos = 0;
    this->m_month = this->m_month + 1;
    if (0xc < this->m_month) {
      this->m_month = 1;
    }
    local_4 = ThisSection;
  }
  else if (key == 0x1000015) {
    this->m_pos = 0;
    this->m_month = this->m_month + -1;
    if (this->m_month < 1) {
      this->m_month = 0xc;
    }
    local_4 = ThisSection;
  }
  else if ((key == 0x1000061) || (key == 0x1000003)) {
    this->m_pos = this->m_pos + -1;
    if (this->m_pos < 0) {
      this->m_pos = 1;
    }
    if (this->m_pos == 0) {
      this->m_month = this->m_oldMonth;
    }
    else {
      this->m_month = this->m_month / 10;
    }
    if (this->m_pos == 0) {
      local_4 = PrevSection;
    }
    else {
      local_4 = ThisSection;
    }
  }
  else if ((key < 0x30) || (0x39 < key)) {
    local_4 = ThisSection;
  }
  else {
    if (this->m_pos == 0) {
      this->m_month = key + -0x30;
    }
    else {
      this->m_month = (this->m_month % 10) * 10 + key + -0x30;
    }
    if (0xc < this->m_month) {
      this->m_month = 0xc;
    }
    this->m_pos = this->m_pos + 1;
    if (this->m_pos < 2) {
      local_4 = ThisSection;
    }
    else {
      this->m_pos = 0;
      local_4 = NextSection;
    }
  }
  return local_4;
}

Assistant:

QCalendarDateSectionValidator::Section QCalendarMonthValidator::handleKey(int key)
{
    if (key == Qt::Key_Right || key == Qt::Key_Left) {
        m_pos = 0;
        return QCalendarDateSectionValidator::ThisSection;
    } else if (key == Qt::Key_Up) {
        m_pos = 0;
        ++m_month;
        if (m_month > 12)
            m_month = 1;
        return QCalendarDateSectionValidator::ThisSection;
    } else if (key == Qt::Key_Down) {
        m_pos = 0;
        --m_month;
        if (m_month < 1)
            m_month = 12;
        return QCalendarDateSectionValidator::ThisSection;
    } else if (key == Qt::Key_Back || key == Qt::Key_Backspace) {
        --m_pos;
        if (m_pos < 0)
            m_pos = 1;

        if (m_pos == 0)
            m_month = m_oldMonth;
        else
            m_month = m_month / 10;
            //m_month = m_oldMonth / 10 * 10 + m_month / 10;

        if (m_pos == 0)
            return QCalendarDateSectionValidator::PrevSection;
        return QCalendarDateSectionValidator::ThisSection;
    }
    if (key < Qt::Key_0 || key > Qt::Key_9)
        return QCalendarDateSectionValidator::ThisSection;
    int pressedKey = key - Qt::Key_0;
    if (m_pos == 0)
        m_month = pressedKey;
    else
        m_month = m_month % 10 * 10 + pressedKey;
    if (m_month > 12)
        m_month = 12;
    ++m_pos;
    if (m_pos > 1) {
        m_pos = 0;
        return QCalendarDateSectionValidator::NextSection;
    }
    return QCalendarDateSectionValidator::ThisSection;
}